

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O2

DdManager * Llb_ImgPartition(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,abctime TimeTarget)

{
  DdManager *unique;
  void *pvVar1;
  DdNode *pDVar2;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  DdNode *pDVar3;
  DdNode *n;
  int iVar4;
  
  unique = Cudd_Init(p->vObjs->nSize,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  unique->TimeStop = TimeTarget;
  for (iVar4 = 0; iVar4 < vLower->nSize; iVar4 = iVar4 + 1) {
    pvVar1 = Vec_PtrEntry(vLower,iVar4);
    pDVar2 = Cudd_bddIthVar(unique,*(int *)((long)pvVar1 + 0x24));
    *(DdNode **)((long)pvVar1 + 0x28) = pDVar2;
  }
  p_00 = Llb_ManCutNodes(p,vLower,vUpper);
  iVar4 = 0;
  do {
    if (p_00->nSize <= iVar4) {
      p_01 = Llb_ManCutRange(p,vLower,vUpper);
      pDVar2 = Cudd_ReadOne(unique);
      Cudd_Ref(pDVar2);
      iVar4 = 0;
      while( true ) {
        if (p_01->nSize <= iVar4) {
          for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
            pvVar1 = Vec_PtrEntry(p_00,iVar4);
            Cudd_RecursiveDeref(unique,*(DdNode **)((long)pvVar1 + 0x28));
          }
          Vec_PtrFree(p_01);
          Vec_PtrFree(p_00);
          Cudd_AutodynDisable(unique);
          unique->bFunc = pDVar2;
          unique->TimeStop = 0;
          return unique;
        }
        pvVar1 = Vec_PtrEntry(p_01,iVar4);
        if ((*(uint *)((long)pvVar1 + 0x18) & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Image.c"
                        ,0xdb,
                        "DdManager *Llb_ImgPartition(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, abctime)"
                       );
        }
        pDVar3 = Cudd_bddIthVar(unique,*(int *)((long)pvVar1 + 0x24));
        pDVar3 = Cudd_bddXnor(unique,pDVar3,*(DdNode **)((long)pvVar1 + 0x28));
        Cudd_Ref(pDVar3);
        n = Cudd_bddAnd(unique,pDVar2,pDVar3);
        if (n == (DdNode *)0x0) break;
        Cudd_Ref(n);
        Cudd_RecursiveDeref(unique,pDVar2);
        Cudd_RecursiveDeref(unique,pDVar3);
        iVar4 = iVar4 + 1;
        pDVar2 = n;
      }
      Cudd_Quit(unique);
      Vec_PtrFree(p_01);
LAB_00699351:
      Vec_PtrFree(p_00);
      return (DdManager *)0x0;
    }
    pvVar1 = Vec_PtrEntry(p_00,iVar4);
    pDVar2 = Cudd_bddAnd(unique,(DdNode *)
                                ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                                *(ulong *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe) +
                                          0x28)),
                         (DdNode *)
                         ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^
                         *(ulong *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) + 0x28)))
    ;
    *(DdNode **)((long)pvVar1 + 0x28) = pDVar2;
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_Quit(unique);
      goto LAB_00699351;
    }
    Cudd_Ref(pDVar2);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

DdManager * Llb_ImgPartition( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, abctime TimeTarget )
{
    Vec_Ptr_t * vNodes, * vRange;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bBdd0, * bBdd1, * bProd, * bRes, * bTemp;
    int i;

    dd = Cudd_Init( Aig_ManObjNumMax(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    dd->TimeStop = TimeTarget;

    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );

    vNodes = Llb_ManCutNodes( p, vLower, vUpper );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );   Cudd_Ref( (DdNode *)pObj->pData );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeTarget );  
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );  
        if ( pObj->pData == NULL )
        {
            Cudd_Quit( dd );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }

    vRange = Llb_ManCutRange( p, vLower, vUpper );
    bRes   = Cudd_ReadOne(dd);   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRange, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), (DdNode *)pObj->pData );   Cudd_Ref( bProd );
//        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd ); Cudd_Ref( bRes );
//        bRes  = Extra_bddAndTime( dd, bTemp = bRes, bProd, TimeTarget );  
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );  
        if ( bRes == NULL )
        {
            Cudd_Quit( dd );
            Vec_PtrFree( vRange );
            Vec_PtrFree( vNodes );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );

    Vec_PtrFree( vRange );
    Vec_PtrFree( vNodes );
    Cudd_AutodynDisable( dd );
//    Cudd_RecursiveDeref( dd, bRes );
//    Extra_StopManager( dd );
    dd->bFunc = bRes;
    dd->TimeStop = 0;
    return dd;
}